

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# login1-server.c
# Opt level: O0

void ssh1_login_server_free(PacketProtocolLayer *ppl)

{
  ssh1_login_server_state *s;
  PacketProtocolLayer *ppl_local;
  
  if (ppl[-2].bpp != (BinaryPacketProtocol *)0x0) {
    ssh_ppl_free((PacketProtocolLayer *)ppl[-2].bpp);
  }
  if (((ppl[-1].ic_process_queue.queued & 1U) != 0) &&
     (ppl[-1].ic_process_queue.fn != (toplevel_callback_fn_t)0x0)) {
    freersakey((RSAKey *)ppl[-1].ic_process_queue.fn);
    safefree(ppl[-1].ic_process_queue.fn);
  }
  smemclr((void *)((long)&ppl[-2].selfptr + 4),0x20);
  safefree(ppl[-1].bpp);
  safefree(ppl + -2);
  return;
}

Assistant:

static void ssh1_login_server_free(PacketProtocolLayer *ppl)
{
    struct ssh1_login_server_state *s =
        container_of(ppl, struct ssh1_login_server_state, ppl);

    if (s->successor_layer)
        ssh_ppl_free(s->successor_layer);

    if (s->servkey_generated_here && s->servkey) {
        freersakey(s->servkey);
        sfree(s->servkey);
    }

    smemclr(s->session_key, sizeof(s->session_key));
    sfree(s->username_str);

    sfree(s);
}